

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall Assimp::LWO::AnimResolver::UpdateAnimRangeSetup(AnimResolver *this)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  const_iterator __position;
  double *pdVar5;
  double __y;
  _List_node_base **this_00;
  _List_node_base *p_Var6;
  size_t __n;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_type __n_00;
  ulong uVar10;
  uint uVar11;
  double *pdVar12;
  _List_node_base *p_Var13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  void *__dest;
  bool bVar18;
  double dVar19;
  value_type local_58;
  
  p_Var6 = (_List_node_base *)this->envelopes;
  p_Var13 = p_Var6;
  do {
    do {
      lVar15 = 0x78;
      p_Var13 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                 &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var13 == p_Var6) {
        return;
      }
      lVar9 = *(long *)(p_Var13 + 2);
      lVar8 = *(long *)((long)(p_Var13 + 2) + 8);
    } while ((lVar9 == lVar8) || (2 < *(int *)((long)(p_Var13 + 1) + 8) - 2U));
    this_00 = &p_Var13[2]._M_next;
    dVar4 = *(double *)lVar9;
    __y = *(double *)(lVar8 + 0xffffffffffffffd8) - dVar4;
    __n = lVar8 - lVar9;
    uVar7 = (long)__n / 0x28;
    fVar2 = *(float *)(lVar8 + 0xffffffffffffffe0);
    fVar3 = *(float *)(lVar9 + 8);
    dVar19 = fmod(dVar4 - this->first,__y);
    dVar19 = __y - dVar19;
    __position._M_current = *(Key **)(p_Var13 + 2);
    pdVar5 = *(double **)((long)(p_Var13 + 2) + 8);
    lVar8 = ((long)pdVar5 - (long)__position._M_current) / 0x28;
    lVar14 = 0;
    for (lVar9 = lVar8 >> 2; 0 < lVar9; lVar9 = lVar9 + -1) {
      pdVar12 = (double *)((long)__position._M_current[-3].params + lVar15 + -0x10);
      if (*pdVar12 <= dVar19 && dVar19 != *pdVar12) {
        pdVar12 = (double *)((long)__position._M_current - lVar14);
        goto LAB_005f9800;
      }
      pdVar12 = (double *)((long)__position._M_current[-2].params + lVar15 + -0x10);
      if (*pdVar12 <= dVar19 && dVar19 != *pdVar12) {
        pdVar12 = (double *)((long)__position._M_current + (0x28 - lVar14));
        goto LAB_005f9800;
      }
      pdVar12 = (double *)((long)__position._M_current[-1].params + lVar15 + -0x10);
      if (*pdVar12 <= dVar19 && dVar19 != *pdVar12) {
        pdVar12 = (double *)((long)__position._M_current + (0x50 - lVar14));
        goto LAB_005f9800;
      }
      pdVar12 = (double *)((long)(__position._M_current)->params + lVar15 + -0x10);
      if (*pdVar12 <= dVar19 && dVar19 != *pdVar12) {
        pdVar12 = (double *)((long)__position._M_current + (0x78 - lVar14));
        goto LAB_005f9800;
      }
      lVar14 = lVar14 + -0xa0;
      lVar15 = lVar15 + 0xa0;
    }
    lVar9 = (((long)pdVar5 - (long)__position._M_current) + lVar14) / 0x28;
    pdVar12 = (double *)((long)__position._M_current - lVar14);
    if (lVar9 == 1) {
LAB_005f98a6:
      if (*pdVar12 <= dVar19 && dVar19 != *pdVar12) goto LAB_005f9800;
LAB_005f98b0:
      __n_00 = 0;
    }
    else {
      if (lVar9 == 3) {
        pdVar1 = (double *)((long)__position._M_current[-3].params + lVar15 + -0x10);
        if (dVar19 < *pdVar1 || dVar19 == *pdVar1) {
          pdVar12 = (double *)((long)__position._M_current + (0x28 - lVar14));
          goto LAB_005f9898;
        }
      }
      else {
        if (lVar9 != 2) goto LAB_005f98b0;
LAB_005f9898:
        if (dVar19 < *pdVar12 || dVar19 == *pdVar12) {
          pdVar12 = pdVar12 + 5;
          goto LAB_005f98a6;
        }
      }
LAB_005f9800:
      if (pdVar12 == pdVar5) goto LAB_005f98b0;
      __n_00 = ((long)pdVar5 - (long)pdVar12) / 0x28;
      local_58.time = 0.0;
      local_58.value = 0.0;
      local_58.inter = IT_LINE;
      local_58.params[0] = 0.0;
      local_58.params[1] = 0.0;
      local_58.params[2] = 0.0;
      local_58.params[3] = 0.0;
      local_58.params[4] = 0.0;
      std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::insert
                ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,__position,
                 __n_00,&local_58);
      memmove(p_Var13[2]._M_next,(void *)(__n_00 * -0x28 + *(long *)((long)(p_Var13 + 2) + 8)),
              (long)pdVar5 - (long)pdVar12);
      lVar8 = (*(long *)((long)(p_Var13 + 2) + 8) - *(long *)(p_Var13 + 2)) / 0x28;
    }
    uVar10 = (ulong)((dVar4 - this->first) / __y);
    uVar16 = uVar10 & 0xffffffff;
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::resize
              ((vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_> *)this_00,
               uVar7 * uVar16 + lVar8);
    lVar15 = (long)*this_00;
    __dest = (void *)(__n_00 * 0x28 + uVar7 * 0x28 + lVar15);
    bVar17 = false;
    while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
      memmove(__dest,(void *)(lVar15 + __n_00 * 0x28),__n);
      bVar18 = *(int *)((long)(p_Var13 + 1) + 8) != 3;
      if (bVar18 || bVar17) {
        bVar17 = (bool)(bVar17 & bVar18);
      }
      else {
        std::
        __reverse<__gnu_cxx::__normal_iterator<Assimp::LWO::Key*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>>
                  (__dest,(long)__dest + (__n - 0x28));
        bVar17 = true;
      }
      __dest = (void *)((long)__dest + uVar7 * 0x28);
    }
    lVar15 = *(long *)((long)(p_Var13 + 2) + 8) + ~uVar7 * 0x28;
    dVar4 = (double)((int)uVar10 + 1) * __y;
    uVar11 = 1;
    for (dVar19 = __y; dVar19 <= dVar4; dVar19 = dVar19 + __y) {
      if ((__y != dVar4) || (NAN(__y) || NAN(dVar4))) {
        lVar9 = lVar15 + ~uVar7 * 0x28;
      }
      else {
        lVar9 = (long)*this_00;
      }
      for (; lVar15 != lVar9; lVar15 = lVar15 + 0xffffffffffffffd8) {
        *(double *)lVar15 = *(double *)lVar15 - dVar19;
        if (*(int *)((long)(p_Var13 + 1) + 8) == 4) {
          *(float *)(lVar15 + 8) = *(float *)(lVar15 + 8) + (float)uVar11 * (fVar2 - fVar3);
        }
      }
      uVar11 = uVar11 + 1;
    }
    p_Var6 = (_List_node_base *)this->envelopes;
  } while( true );
}

Assistant:

void AnimResolver::UpdateAnimRangeSetup()
{
    // XXX doesn't work yet (hangs if more than one envelope channels needs to be interpolated)

    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {
        if ((*it).keys.empty()) continue;

        const double my_first = (*it).keys.front().time;
        const double my_last  = (*it).keys.back().time;

        const double delta = my_last-my_first;
        const size_t old_size = (*it).keys.size();

        const float value_delta = (*it).keys.back().value - (*it).keys.front().value;

        // NOTE: We won't handle reset, linear and constant here.
        // See DoInterpolation() for their implementation.

        // process pre behaviour
        switch ((*it).pre) {
            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:
                {
                const double start_time = delta - std::fmod(my_first-first,delta);
                std::vector<LWO::Key>::iterator n = std::find_if((*it).keys.begin(),(*it).keys.end(),
                    [start_time](double t) { return start_time > t; }),m;

                size_t ofs = 0;
                if (n != (*it).keys.end()) {
                    // copy from here - don't use iterators, insert() would invalidate them
                    ofs = (*it).keys.end()-n;
                    (*it).keys.insert((*it).keys.begin(),ofs,LWO::Key());

                    std::copy((*it).keys.end()-ofs,(*it).keys.end(),(*it).keys.begin());
                }

                // do full copies. again, no iterators
                const unsigned int num = (unsigned int)((my_first-first) / delta);
                (*it).keys.resize((*it).keys.size() + num*old_size);

                n = (*it).keys.begin()+ofs;
                bool reverse = false;
                for (unsigned int i = 0; i < num; ++i) {
                    m = n+old_size*(i+1);
                    std::copy(n,n+old_size,m);

                    if ((*it).pre == LWO::PrePostBehaviour_Oscillate && (reverse = !reverse))
                        std::reverse(m,m+old_size-1);
                }

                // update time values
                n = (*it).keys.end() - (old_size+1);
                double cur_minus = delta;
                unsigned int tt = 1;
                for (const double tmp =  delta*(num+1);cur_minus <= tmp;cur_minus += delta,++tt) {
                    m = (delta == tmp ? (*it).keys.begin() :  n - (old_size+1));
                    for (;m != n; --n) {
                        (*n).time -= cur_minus;

                        // offset repeat? add delta offset to key value
                        if ((*it).pre == LWO::PrePostBehaviour_OffsetRepeat) {
                            (*n).value += tt * value_delta;
                        }
                    }
                }
                break;
                }
            default:
                // silence compiler warning
                break;
        }

        // process post behaviour
        switch ((*it).post) {

            case LWO::PrePostBehaviour_OffsetRepeat:
            case LWO::PrePostBehaviour_Repeat:
            case LWO::PrePostBehaviour_Oscillate:

                break;

            default:
                // silence compiler warning
                break;
        }
    }
}